

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser.cxx
# Opt level: O3

void __thiscall Fl_Browser::item_draw(Fl_Browser *this,void *item,int X,int Y,int W,int H)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  long *plVar4;
  int iVar5;
  Fl_Align align;
  uint uVar6;
  void *pvVar7;
  int iVar8;
  Fl_Color FVar9;
  char *pcVar10;
  byte *pbVar11;
  ulong uVar12;
  ulong uVar13;
  undefined4 extraout_var;
  byte bVar14;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  byte *__s;
  undefined4 in_register_0000008c;
  bool bVar15;
  uint local_a4;
  byte *local_a0;
  uint local_94;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  uint local_78;
  uint local_74;
  void *local_70;
  ulong local_68;
  undefined8 local_60;
  ulong local_58;
  uint *local_50;
  int local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  ulong local_38;
  
  local_58 = CONCAT44(in_register_0000008c,H);
  local_88 = CONCAT44(in_register_00000014,X);
  local_60 = CONCAT44(in_register_0000000c,Y);
  if (6 < W) {
    __s = (byte *)((long)item + 0x23);
    local_50 = (uint *)this->column_widths_;
    local_48 = Y + 1;
    local_3c = (Y + H) - 1;
    iVar8 = (int)(((uint)(local_58 >> 0x1f) & 1) + H) >> 1;
    local_40 = iVar8 + Y + 1;
    local_44 = iVar8 + Y;
    bVar15 = true;
    local_a4 = W;
    local_70 = item;
    do {
      if ((*local_50 == 0) ||
         (pcVar10 = strchr((char *)__s,(int)this->column_char_), pcVar10 == (char *)0x0)) {
        pcVar10 = (char *)0x0;
        uVar3 = local_a4;
      }
      else {
        *pcVar10 = '\0';
        uVar3 = *local_50;
        local_50 = local_50 + 1;
      }
      pvVar7 = local_70;
      local_90 = (ulong)uVar3;
      if ((bVar15) && (plVar4 = *(long **)((long)local_70 + 0x18), plVar4 != (long *)0x0)) {
        iVar5 = (int)local_88;
        (**(code **)(*plVar4 + 0x38))
                  (plVar4,iVar5 + 2,local_48,(int)plVar4[1],*(undefined4 *)((long)plVar4 + 0xc),0,0)
        ;
        iVar8 = *(int *)(*(long *)((long)pvVar7 + 0x18) + 8);
        local_88 = (ulong)(iVar5 + iVar8 + 2);
        iVar8 = iVar8 + 2;
        local_a4 = local_a4 - iVar8;
        local_90 = (ulong)(uint)((int)local_90 - iVar8);
      }
      uVar13 = (ulong)(uint)(this->super_Fl_Browser_).textfont_;
      uVar12 = (ulong)(uint)(this->super_Fl_Browser_).textsize_;
      local_80 = (ulong)(this->super_Fl_Browser_).textcolor_;
      bVar14 = *__s;
      if (bVar14 == this->format_char_) {
        local_74 = (int)local_88 + 3;
        local_78 = ((int)local_90 + (int)local_88) - 3;
        local_94 = 4;
        local_a0 = __s;
        do {
          pbVar11 = local_a0 + 1;
          bVar2 = local_a0[1];
          if ((bVar2 == 0) || (bVar2 == bVar14)) {
            __s = local_a0 + 1;
            local_a0 = pbVar11;
            break;
          }
          __s = local_a0 + 2;
          if (bVar2 < 0x5f) {
            switch(bVar2) {
            case 0x40:
              __s = local_a0 + 1;
              local_a0 = __s;
              goto LAB_001a6733;
            case 0x41:
            case 0x44:
            case 0x45:
            case 0x47:
            case 0x48:
            case 0x49:
            case 0x4a:
            case 0x4b:
            case 0x4f:
            case 0x50:
            case 0x51:
            case 0x52:
              break;
            case 0x42:
              if ((*(byte *)((long)local_70 + 0x22) & 1) == 0) {
                local_a0 = __s;
                local_68 = uVar13;
                uVar13 = strtol((char *)__s,(char **)&local_a0,10);
                (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                          (fl_graphics_driver,uVar13 & 0xffffffff);
                (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
                          (fl_graphics_driver,local_88,local_60,local_90,local_58);
                uVar13 = local_68;
                __s = local_a0;
              }
              else {
                do {
                  pbVar1 = pbVar11 + 1;
                  pbVar11 = pbVar11 + 1;
                  __s = pbVar11;
                } while (*pbVar1 - 0x30 < 10);
              }
              break;
            case 0x43:
              local_a0 = __s;
              local_80 = strtol((char *)__s,(char **)&local_a0,10);
              __s = local_a0;
              break;
            case 0x46:
              local_a0 = __s;
              uVar13 = strtol((char *)__s,(char **)&local_a0,10);
              __s = local_a0;
              break;
            case 0x4c:
switchD_001a651e_caseD_6c:
              uVar12 = 0x18;
              break;
            case 0x4d:
switchD_001a651e_caseD_6d:
              uVar12 = 0x12;
              break;
            case 0x4e:
              local_80 = 8;
              break;
            case 0x53:
              local_a0 = __s;
              uVar12 = strtol((char *)__s,(char **)&local_a0,10);
              __s = local_a0;
              break;
            default:
              if (bVar2 == 0x2d) {
                local_a0 = __s;
                local_68 = uVar13;
                local_38 = uVar12;
                (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                          (fl_graphics_driver,0x27);
                uVar6 = local_74;
                uVar3 = local_78;
                (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])
                          (fl_graphics_driver,(ulong)local_74,(ulong)local_44,(ulong)local_78,
                           (ulong)local_44);
                (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                          (fl_graphics_driver,0x36);
                (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])
                          (fl_graphics_driver,(ulong)uVar6,(ulong)local_40,(ulong)uVar3,
                           (ulong)local_40);
                uVar12 = local_38;
                uVar13 = local_68;
                __s = local_a0;
              }
              else {
                local_a0 = __s;
                if (bVar2 == 0x2e) goto LAB_001a6733;
              }
            }
          }
          else {
            switch(bVar2) {
            case 0x5f:
            case 0x75:
              local_a0 = __s;
              (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                        (fl_graphics_driver,local_80);
              (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])
                        (fl_graphics_driver,(ulong)local_74,(ulong)local_3c,(ulong)local_78,
                         (ulong)local_3c);
              __s = local_a0;
              break;
            case 0x62:
              uVar13 = (ulong)((uint)uVar13 | 1);
              break;
            case 99:
              local_94 = 0;
              break;
            case 0x66:
            case 0x74:
              uVar13 = 4;
              break;
            case 0x69:
              uVar13 = (ulong)((uint)uVar13 | 2);
              break;
            case 0x6c:
              goto switchD_001a651e_caseD_6c;
            case 0x6d:
              goto switchD_001a651e_caseD_6d;
            case 0x72:
              local_94 = 8;
              break;
            case 0x73:
              uVar12 = 0xb;
            }
          }
          local_a0 = __s;
          bVar14 = *local_a0;
          __s = local_a0;
        } while (bVar14 == this->format_char_);
      }
      else {
        local_94 = 4;
      }
LAB_001a6733:
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
                (fl_graphics_driver,uVar13,uVar12 & 0xffffffff);
      if ((*(byte *)((long)local_70 + 0x22) & 1) != 0) {
        FVar9 = fl_contrast((Fl_Color)local_80,
                            (this->super_Fl_Browser_).super_Fl_Group.super_Fl_Widget.color2_);
        local_80 = CONCAT44(extraout_var,FVar9);
      }
      uVar12 = local_90;
      iVar8 = Fl_Widget::active_r((Fl_Widget *)this);
      uVar13 = local_80;
      if (iVar8 == 0) {
        FVar9 = fl_inactive((Fl_Color)local_80);
        uVar13 = (ulong)FVar9;
      }
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,uVar13);
      iVar8 = (int)uVar12;
      align = local_94 | 0x40;
      if (pcVar10 == (char *)0x0) {
        align = local_94;
      }
      fl_draw((char *)__s,(int)local_88 + 3,(int)local_60,iVar8 + -6,(int)local_58,align,
              (Fl_Image *)0x0,0);
      if (pcVar10 == (char *)0x0) {
        return;
      }
      *pcVar10 = this->column_char_;
      local_88 = (ulong)(uint)((int)local_88 + iVar8);
      local_a4 = local_a4 - iVar8;
      __s = (byte *)(pcVar10 + 1);
      bVar15 = false;
      local_a0 = __s;
    } while (6 < (int)local_a4);
  }
  return;
}

Assistant:

void Fl_Browser::item_draw(void* item, int X, int Y, int W, int H) const {
  FL_BLINE* l = (FL_BLINE*)item;
  char* str = l->txt;
  const int* i = column_widths();

  bool first = true;	// for icon
  while (W > 6) {	// do each tab-separated field
    int w1 = W;	// width for this field
    char* e = 0; // pointer to end of field or null if none
    if (*i) { // find end of field and temporarily replace with 0
      e = strchr(str, column_char());
      if (e) {*e = 0; w1 = *i++;}
    }
    // Icon drawing code
    if (first) {
      first = false;
      if (l->icon) {
	l->icon->draw(X+2,Y+1);	// leave 2px left, 1px above
	int iconw = l->icon->w()+2;
	X += iconw; W -= iconw; w1 -= iconw;
      }
    }
    int tsize = textsize();
    Fl_Font font = textfont();
    Fl_Color lcol = textcolor();
    Fl_Align talign = FL_ALIGN_LEFT;
    // check for all the @-lines recognized by XForms:
    //#if defined(__GNUC__)
    //#warning FIXME This maybe needs to be more UTF8 aware now...?
    //#endif /*__GNUC__*/
    while (*str == format_char() && *++str && *str != format_char()) {
      switch (*str++) {
      case 'l': case 'L': tsize = 24; break;
      case 'm': case 'M': tsize = 18; break;
      case 's': tsize = 11; break;
      case 'b': font = (Fl_Font)(font|FL_BOLD); break;
      case 'i': font = (Fl_Font)(font|FL_ITALIC); break;
      case 'f': case 't': font = FL_COURIER; break;
      case 'c': talign = FL_ALIGN_CENTER; break;
      case 'r': talign = FL_ALIGN_RIGHT; break;
      case 'B': 
	if (!(l->flags & SELECTED)) {
	  fl_color((Fl_Color)strtol(str, &str, 10));
	  fl_rectf(X, Y, w1, H);
	} else while (isdigit(*str & 255)) str++; // skip digits
        break;
      case 'C':
	lcol = (Fl_Color)strtol(str, &str, 10);
	break;
      case 'F':
	font = (Fl_Font)strtol(str, &str, 10);
	break;
      case 'N':
	lcol = FL_INACTIVE_COLOR;
	break;
      case 'S':
	tsize = strtol(str, &str, 10);
	break;
      case '-':
	fl_color(FL_DARK3);
	fl_line(X+3, Y+H/2, X+w1-3, Y+H/2);
	fl_color(FL_LIGHT3);
	fl_line(X+3, Y+H/2+1, X+w1-3, Y+H/2+1);
	break;
      case 'u':
      case '_':
	fl_color(lcol);
	fl_line(X+3, Y+H-1, X+w1-3, Y+H-1);
	break;
      case '.':
	goto BREAK;
      case '@':
	str--; goto BREAK;
      }
    }
  BREAK:
    fl_font(font, tsize);
    if (l->flags & SELECTED)
      lcol = fl_contrast(lcol, selection_color());
    if (!active_r()) lcol = fl_inactive(lcol);
    fl_color(lcol);
    fl_draw(str, X+3, Y, w1-6, H, e ? Fl_Align(talign|FL_ALIGN_CLIP) : talign, 0, 0);
    if (!e) break; // no more fields...
    *e = column_char(); // put the separator back
    X += w1;
    W -= w1;
    str = e+1;
  }
}